

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

void __thiscall
GCSFilter::GCSFilter
          (GCSFilter *this,Params *params,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *encoded_filter,
          bool skip_decode_check)

{
  long lVar1;
  size_t sVar2;
  Span<const_unsigned_char> data;
  bool bVar3;
  uint64_t uVar4;
  char *pcVar5;
  error_code *this_00;
  byte in_CL;
  undefined8 in_RDX;
  SpanReader *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  uint64_t i;
  uint64_t N;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  BitStreamReader<SpanReader> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar6;
  io_errc in_stack_ffffffffffffff14;
  io_errc __e;
  error_code *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ulong local_98;
  undefined1 range_check;
  
  range_check = (undefined1)((ulong)in_RDX >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[2] = in_RSI[1].m_data.m_data;
  sVar2 = (in_RSI->m_data).m_size;
  *in_RDI = (in_RSI->m_data).m_data;
  in_RDI[1] = sVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff08,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x8c0cdd);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  data.m_data._4_4_ = in_stack_ffffffffffffff14;
  data.m_data._0_4_ = in_stack_ffffffffffffff10;
  data.m_size = (size_t)in_stack_ffffffffffffff18;
  SpanReader::SpanReader((SpanReader *)in_stack_ffffffffffffff08,data);
  uVar4 = ReadCompactSize<SpanReader>(in_RSI,(bool)range_check);
  *(int *)(in_RDI + 3) = (int)uVar4;
  if (*(uint *)(in_RDI + 3) == uVar4) {
    in_RDI[4] = (ulong)*(uint *)(in_RDI + 3) * (ulong)*(uint *)((long)in_RDI + 0x14);
    if ((in_CL & 1) == 0) {
      BitStreamReader<SpanReader>::BitStreamReader(in_stack_ffffffffffffff08,(SpanReader *)0x8c0e3b)
      ;
      for (local_98 = 0; local_98 < *(uint *)(in_RDI + 3); local_98 = local_98 + 1) {
        GolombRiceDecode<SpanReader>
                  ((BitStreamReader<SpanReader> *)
                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                   (uint8_t)((ulong)in_stack_ffffffffffffff20 >> 0x38));
      }
      bVar3 = SpanReader::empty((SpanReader *)in_stack_ffffffffffffff08);
      if (!bVar3) {
        this_00 = (error_code *)__cxa_allocate_exception(0x20);
        uVar6 = SUB84(this_00,0);
        __e = (io_errc)((ulong)this_00 >> 0x20);
        std::error_code::error_code<std::io_errc,void>(this_00,__e);
        std::ios_base::failure[abi:cxx11]::failure
                  ((char *)this_00,(error_code *)"encoded_filter contains excess data");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(CONCAT44(__e,uVar6),&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_008c0f88;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"N must be <2^32");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_008c0f88:
  __stack_chk_fail();
}

Assistant:

GCSFilter::GCSFilter(const Params& params, std::vector<unsigned char> encoded_filter, bool skip_decode_check)
    : m_params(params), m_encoded(std::move(encoded_filter))
{
    SpanReader stream{m_encoded};

    uint64_t N = ReadCompactSize(stream);
    m_N = static_cast<uint32_t>(N);
    if (m_N != N) {
        throw std::ios_base::failure("N must be <2^32");
    }
    m_F = static_cast<uint64_t>(m_N) * static_cast<uint64_t>(m_params.m_M);

    if (skip_decode_check) return;

    // Verify that the encoded filter contains exactly N elements. If it has too much or too little
    // data, a std::ios_base::failure exception will be raised.
    BitStreamReader bitreader{stream};
    for (uint64_t i = 0; i < m_N; ++i) {
        GolombRiceDecode(bitreader, m_params.m_P);
    }
    if (!stream.empty()) {
        throw std::ios_base::failure("encoded_filter contains excess data");
    }
}